

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O2

void testHuf(string *param_1)

{
  int i;
  ostream *poVar1;
  long lVar2;
  int iVar3;
  Rand48 *in_RCX;
  Rand48 *rand48_00;
  Rand48 *rand48_01;
  Rand48 *rand48_02;
  Rand48 *rand48_03;
  Array<unsigned_short> raw;
  Rand48 rand48;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing Huffman encoder");
  std::endl<char,std::char_traits<char>>(poVar1);
  rand48._state[0] = 0x5a5a;
  rand48._state[1] = 0x5a5a;
  rand48._state[2] = 0x5a5a;
  raw._data = (unsigned_short *)operator_new__(2000000);
  raw._size = 1000000;
  anon_unknown.dwarf_1382a9::fill1(raw._data,(int)&rand48,1.0,rand48_00);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,1000000);
  anon_unknown.dwarf_1382a9::fill1(raw._data,(int)&rand48,10.0,rand48_01);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,1000000);
  anon_unknown.dwarf_1382a9::fill1(raw._data,(int)&rand48,100.0,rand48_02);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,1000000);
  anon_unknown.dwarf_1382a9::fill1(raw._data,(int)&rand48,1000.0,rand48_03);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,1000000);
  anon_unknown.dwarf_1382a9::fill2(raw._data,1,(int)&rand48,in_RCX);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,1000000);
  anon_unknown.dwarf_1382a9::fill2(raw._data,10,(int)&rand48,in_RCX);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,1000000);
  anon_unknown.dwarf_1382a9::fill2(raw._data,100,(int)&rand48,in_RCX);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,1000000);
  anon_unknown.dwarf_1382a9::fill2(raw._data,1000,(int)&rand48,in_RCX);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,1000000);
  for (lVar2 = 0; lVar2 != 1000000; lVar2 = lVar2 + 1) {
    raw._data[lVar2] = 0;
  }
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,1000000);
  for (lVar2 = 0; lVar2 != 1000000; lVar2 = lVar2 + 1) {
    raw._data[lVar2] = 1;
  }
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,1000000);
  for (lVar2 = 0; lVar2 != 1000000; lVar2 = lVar2 + 1) {
    raw._data[lVar2] = 0xfffe;
  }
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,1000000);
  for (lVar2 = 0; lVar2 != 1000000; lVar2 = lVar2 + 1) {
    raw._data[lVar2] = 0xffff;
  }
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,1000000);
  anon_unknown.dwarf_1382a9::fill4(raw._data,0x10000);
  anon_unknown.dwarf_1382a9::compressVerify(raw._data,0x10000,0x7801c026);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,0x10000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,0x10000);
  anon_unknown.dwarf_1382a9::fill4(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressVerify(raw._data,1000000,0xcbf8e21);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,1000000);
  anon_unknown.dwarf_1382a9::fill4(raw._data,0);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,0);
  anon_unknown.dwarf_1382a9::fill4(raw._data,1);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1);
  anon_unknown.dwarf_1382a9::fill4(raw._data,2);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,2);
  anon_unknown.dwarf_1382a9::fill4(raw._data,3);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,3);
  for (lVar2 = 0; lVar2 != 1000000; lVar2 = lVar2 + 1) {
    raw._data[lVar2] = 0;
  }
  iVar3 = 0;
  for (lVar2 = 0; raw._data[lVar2] = (unsigned_short)iVar3, lVar2 != 0x16a; lVar2 = lVar2 + 1) {
    iVar3 = iVar3 + (int)lVar2;
  }
  anon_unknown.dwarf_1382a9::compressVerify(raw._data,1000000,0x9497e34a);
  anon_unknown.dwarf_1382a9::compressUncompress(raw._data,1000000);
  anon_unknown.dwarf_1382a9::compressUncompressSubset(raw._data,1000000);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  Imf_2_5::Array<unsigned_short>::~Array(&raw);
  return;
}

Assistant:

void
testHuf (const std::string&)
{
    try
    {
	cout << "Testing Huffman encoder" << endl;

	IMATH_NAMESPACE::Rand48 rand48 (0);

	const int N = 1000000;
	Array <unsigned short> raw (N);

	fill1 (raw, N, 1, rand48);	  // test various symbol distributions
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill1 (raw, N, 10, rand48);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill1 (raw, N, 100, rand48);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill1 (raw, N, 1000, rand48);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);

	fill2 (raw, N, 1, rand48);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill2 (raw, N, 10, rand48);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill2 (raw, N, 100, rand48);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill2 (raw, N, 1000, rand48);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);

	fill3 (raw, N, 0);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill3 (raw, N, 1);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill3 (raw, N, USHRT_MAX - 1);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);
	fill3 (raw, N, USHRT_MAX);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);

	fill4 (raw, USHRT_MAX + 1);
        compressVerify(raw, USHRT_MAX + 1, HUF_COMPRESS_DEK_HASH_FOR_FILL4_USHRT_MAX_PLUS_ONE);
	compressUncompress (raw, USHRT_MAX + 1);
	compressUncompressSubset (raw, USHRT_MAX + 1);
	fill4 (raw, N);
        compressVerify(raw, N, HUF_COMPRESS_DEK_HASH_FOR_FILL4_N);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);

	fill4 (raw, 0);
	compressUncompress (raw, 0);	// test small input data sets
	fill4 (raw, 1);
	compressUncompress (raw, 1);
	fill4 (raw, 2);
	compressUncompress (raw, 2);
	fill4 (raw, 3);
	compressUncompress (raw, 3);

	fill5 (raw, N);			// test run-length coding of code table
        compressVerify(raw, N, HUF_COMPRESS_DEK_HASH_FOR_FILL5_N);
	compressUncompress (raw, N);
	compressUncompressSubset (raw, N);

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}